

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

string * flatbuffers::NumToString<unsigned_long>(string *__return_storage_ptr__,unsigned_long t)

{
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string NumToString(T t) {
  // clang-format off

  #ifndef FLATBUFFERS_PREFER_PRINTF
    std::stringstream ss;
    ss << t;
    return ss.str();
  #else // FLATBUFFERS_PREFER_PRINTF
    auto v = static_cast<long long>(t);
    return NumToStringImplWrapper(v, "%.*lld");
  #endif // FLATBUFFERS_PREFER_PRINTF
  // clang-format on
}